

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O0

SemaphoreWrapper * __thiscall
VulkanUtilities::VulkanLogicalDevice::CreateTimelineSemaphore
          (SemaphoreWrapper *__return_storage_ptr__,VulkanLogicalDevice *this,uint64_t InitialValue,
          char *DebugName)

{
  Char *Message;
  undefined1 local_90 [8];
  VkSemaphoreCreateInfo SemaphoreCI;
  VkSemaphoreTypeCreateInfo TimelineCI;
  undefined1 local_48 [8];
  string msg;
  char *DebugName_local;
  uint64_t InitialValue_local;
  VulkanLogicalDevice *this_local;
  
  msg.field_2._8_8_ = DebugName;
  if ((this->m_EnabledExtFeatures).TimelineSemaphore.timelineSemaphore != 1) {
    Diligent::FormatString<char[26],char[68]>
              ((string *)local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_EnabledExtFeatures.TimelineSemaphore.timelineSemaphore == VK_TRUE",
               (char (*) [68])DebugName);
    Message = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (Message,"CreateTimelineSemaphore",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0x16e);
    std::__cxx11::string::~string((string *)local_48);
  }
  memset(&SemaphoreCI.flags,0,0x20);
  SemaphoreCI.flags = 0x3b9df29a;
  memset(local_90,0,0x18);
  local_90._0_4_ = VK_STRUCTURE_TYPE_SEMAPHORE_CREATE_INFO;
  SemaphoreCI._0_8_ = &SemaphoreCI.flags;
  CreateVulkanObject<VkSemaphore_T*,(VulkanUtilities::VulkanHandleTypeId)17,VkResult(*)(VkDevice_T*,VkSemaphoreCreateInfo_const*,VkAllocationCallbacks_const*,VkSemaphore_T**),VkSemaphoreCreateInfo>
            (__return_storage_ptr__,this,
             (_func_VkResult_VkDevice_T_ptr_VkSemaphoreCreateInfo_ptr_VkAllocationCallbacks_ptr_VkSemaphore_T_ptr_ptr
              *)vkCreateSemaphore,(VkSemaphoreCreateInfo *)local_90,(char *)msg.field_2._8_8_,
             "timeline semaphore");
  return __return_storage_ptr__;
}

Assistant:

SemaphoreWrapper VulkanLogicalDevice::CreateTimelineSemaphore(uint64_t InitialValue, const char* DebugName) const
{
    VERIFY_EXPR(m_EnabledExtFeatures.TimelineSemaphore.timelineSemaphore == VK_TRUE);

    VkSemaphoreTypeCreateInfo TimelineCI{};
    TimelineCI.sType         = VK_STRUCTURE_TYPE_SEMAPHORE_TYPE_CREATE_INFO;
    TimelineCI.semaphoreType = VK_SEMAPHORE_TYPE_TIMELINE;
    TimelineCI.initialValue  = InitialValue;

    VkSemaphoreCreateInfo SemaphoreCI{};
    SemaphoreCI.sType = VK_STRUCTURE_TYPE_SEMAPHORE_CREATE_INFO;
    SemaphoreCI.pNext = &TimelineCI;

    return CreateVulkanObject<VkSemaphore, VulkanHandleTypeId::Semaphore>(vkCreateSemaphore, SemaphoreCI, DebugName, "timeline semaphore");
}